

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall vkt::shaderexecutor::StatementP::StatementP(StatementP *this,Statement *ptr)

{
  Statement *ptr_local;
  StatementP *this_local;
  
  de::SharedPtr<const_vkt::shaderexecutor::Statement>::SharedPtr
            (&this->super_SharedPtr<const_vkt::shaderexecutor::Statement>,ptr);
  return;
}

Assistant:

explicit	StatementP			(const Statement* ptr)	: Super(ptr) {}